

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

_Bool no_vault(wchar_t place)

{
  level_conflict *plVar1;
  level_conflict *lev;
  wchar_t place_local;
  
  plVar1 = world->levels;
  if (plVar1[place].topography == TOP_MOUNTAINTOP) {
    lev._7_1_ = true;
  }
  else if ((plVar1[place].topography == TOP_CAVE) || (plVar1[place].down == (char *)0x0)) {
    lev._7_1_ = false;
  }
  else {
    lev._7_1_ = true;
  }
  return lev._7_1_;
}

Assistant:

bool no_vault(int place)
{
	struct level *lev = &world->levels[place];

	/* No vaults on mountaintops */
	if (lev->topography == TOP_MOUNTAINTOP)
		return true;

	/* No vaults on dungeon entrances */
	if ((lev->topography != TOP_CAVE) && (lev->down))
		return true;

	/* Anywhere else is OK */
	return false;
}